

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

int ws_dialer_set_send_text(void *arg,void *buf,size_t sz,nni_type t)

{
  _Bool local_35;
  int local_34;
  _Bool b;
  void *pvStack_30;
  int rv;
  nni_ws_dialer *d;
  size_t sStack_20;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  pvStack_30 = arg;
  d._4_4_ = t;
  sStack_20 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  local_34 = nni_copyin_bool(&local_35,buf,sz,t);
  if (local_34 == 0) {
    nni_mtx_lock((nni_mtx *)((long)pvStack_30 + 0x58));
    *(byte *)((long)pvStack_30 + 0xe2) = local_35 & 1;
    nni_mtx_unlock((nni_mtx *)((long)pvStack_30 + 0x58));
  }
  return local_34;
}

Assistant:

static int
ws_dialer_set_send_text(void *arg, const void *buf, size_t sz, nni_type t)
{
	nni_ws_dialer *d = arg;
	int            rv;
	bool           b;

	if ((rv = nni_copyin_bool(&b, buf, sz, t)) == 0) {
		nni_mtx_lock(&d->mtx);
		d->send_text = b;
		nni_mtx_unlock(&d->mtx);
	}
	return (rv);
}